

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestresult.cpp
# Opt level: O0

void formatFailMessage<long_long,long_long>
               (char *msg,size_t maxMsgLen,char *failureMsg,longlong *val1,longlong *val2,
               char *actual,char *expected,ComparisonOperation op)

{
  char *pcVar1;
  char *pcVar2;
  char *in_stack_00000018;
  char *in_stack_00000020;
  char *val2S;
  char *val1S;
  char *in_stack_00000080;
  ComparisonOperation in_stack_00000088;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  
  pcVar1 = QTest::toString<long_long>
                     ((qint64 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  pcVar2 = QTest::toString<long_long>
                     ((qint64 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  formatFailMessage((char *)val2,(size_t)actual,val1S,val2S,in_stack_00000020,in_stack_00000018,
                    in_stack_00000080,in_stack_00000088);
  if (pcVar1 != (char *)0x0) {
    operator_delete__(pcVar1);
  }
  if (pcVar2 != (char *)0x0) {
    operator_delete__(pcVar2);
  }
  return;
}

Assistant:

static Q_DECL_COLD_FUNCTION
void formatFailMessage(char *msg, size_t maxMsgLen,
                       const char *failureMsg,
                       const Actual &val1, const Expected &val2,
                       const char *actual, const char *expected,
                       QTest::ComparisonOperation op)
{
    const char *val1S = QTest::toString(val1);
    const char *val2S = QTest::toString(val2);

    formatFailMessage(msg, maxMsgLen, failureMsg, val1S, val2S, actual, expected, op);

    delete [] val1S;
    delete [] val2S;
}